

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::Encode(idx2_file *Idx2,params *P,brick_copier *Copier)

{
  allocator **this;
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  volume_iterator<double> Beg;
  volume_iterator<double> End_00;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  allocator *paVar10;
  long lVar11;
  u64 uVar12;
  brick_volume *Val;
  long *in_FS_OFFSET;
  bool bVar13;
  double in_XMM1_Qa;
  extent eVar14;
  error<idx2::idx2_err_code> eVar15;
  error<idx2::idx2_err_code> eVar16;
  v3i Brick3;
  double local_36e0;
  allocator *local_36d0;
  char local_35e9;
  char local_35c1;
  char local_3599;
  brick_traverse *local_3578;
  undefined2 local_3550;
  bool bStack_354e;
  anon_class_1_0_00000001 local_3541;
  char *local_3540;
  cstr MetaFileName;
  undefined8 local_3530;
  anon_class_8_1_32d6a57b local_3528;
  undefined7 local_3520;
  undefined4 uStack_3519;
  undefined5 uStack_3515;
  undefined1 auStack_3510 [8];
  error<idx2::idx2_err_code> Result_1;
  undefined2 local_34f0;
  bool bStack_34ee;
  anon_class_8_1_32d6a57b local_34e8;
  undefined7 local_34e0;
  undefined4 uStack_34d9;
  undefined5 uStack_34d5;
  undefined1 auStack_34d0 [8];
  error<idx2::idx2_err_code> Result;
  timer Timer;
  undefined8 local_34a0;
  long local_3498;
  undefined8 local_348c;
  undefined4 local_3484;
  undefined8 local_3480;
  int local_3478;
  undefined8 local_3470;
  long local_3468;
  undefined8 local_345c;
  int local_3454;
  undefined8 local_3450;
  undefined4 local_3448;
  undefined8 local_3440;
  long local_3438;
  undefined8 local_342c;
  undefined4 local_3424;
  undefined8 local_3420;
  int local_3418;
  undefined8 local_3410;
  long local_3408;
  undefined8 local_33fc;
  int local_33f4;
  undefined8 local_33f0;
  int local_33e8;
  undefined8 local_33dc;
  int local_33d4;
  long local_33d0;
  long local_33c8;
  long local_33c0;
  undefined8 local_33b8;
  int local_33b0;
  extent local_33a8;
  extent local_3398;
  undefined8 local_3384;
  int local_337c;
  undefined8 local_3378;
  int local_3370;
  extent local_3368;
  extent local_3358;
  undefined8 local_3344;
  int local_333c;
  long local_3338;
  long local_3330;
  long local_3328;
  undefined8 local_3320;
  uint local_3318;
  undefined8 local_330c;
  uint local_3304;
  undefined1 local_3300 [8];
  extent Skip;
  brick_traverse Second;
  brick_traverse First;
  unsigned_long *local_3250;
  u64 BrickKey;
  uint local_3240;
  ulong local_3238;
  uint local_3230;
  allocator *local_3228;
  v2d MinMax;
  extent local_3208;
  undefined1 local_31f8 [8];
  extent BrickExtentCrop;
  undefined8 local_31d4;
  uint local_31cc;
  undefined1 local_31c8 [8];
  extent BrickExtent;
  undefined1 auStack_31b0 [8];
  volume_iterator<double> Iter_1;
  volume_iterator<double> Iter;
  brick_volume BVol;
  timer Timer_1;
  undefined8 local_3110;
  int local_3108;
  uint local_3104;
  ulong *puStack_3100;
  int DD;
  brick_traverse *Top;
  int local_30f0;
  undefined4 local_30e4;
  undefined4 local_30e0;
  undefined4 local_30dc;
  unsigned_long local_30d8;
  unsigned_long local_30d0;
  undefined4 local_30c8;
  undefined4 local_30c4;
  undefined4 local_30c0;
  brick_traverse *local_30bc;
  int local_30b4;
  undefined8 local_30b0;
  undefined4 local_30a8;
  undefined8 local_30a0;
  undefined4 local_3098;
  undefined4 local_3094;
  v3i BrickDims3Ext;
  int TopIdx;
  brick_traverse Stack [128];
  undefined1 local_1070 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Encode_cpp:394:3)>
  __ScopeGuard__394;
  anon_class_8_1_54a397e5_for_Func __CleanUpFunc__394;
  encode_data E;
  int BrickBytes;
  brick_copier *Copier_local;
  params *P_local;
  idx2_file *Idx2_local;
  undefined2 local_c68;
  undefined1 uStack_c66;
  undefined5 uStack_c65;
  int local_c48;
  undefined4 local_c38;
  undefined4 local_c28;
  undefined8 local_ad8;
  int local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined8 *local_ac0;
  undefined4 local_ab4;
  undefined8 *local_ab0;
  undefined8 local_aa8;
  int local_aa0;
  u64 *local_a98;
  undefined1 *local_a90;
  undefined8 local_a88;
  int local_a7c;
  int local_a78;
  int local_a74;
  undefined8 *local_a70;
  undefined8 local_a68;
  uint local_a60;
  u64 *local_a58;
  undefined1 *local_a50;
  undefined8 local_a48;
  uint local_a3c;
  int local_a38;
  int local_a34;
  undefined8 *local_a30;
  undefined8 local_a28;
  int local_a20;
  u64 *local_a18;
  int *local_a10;
  undefined8 local_a08;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  undefined8 *local_9f0;
  idx2_err_code *local_9e8;
  i8 *local_9e0;
  undefined8 local_9d8;
  int local_9d0;
  undefined8 local_9c8;
  int local_9c0;
  undefined8 local_9bc;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_9b0;
  undefined4 local_9a4;
  undefined8 *local_9a0;
  undefined8 local_998;
  int local_990;
  undefined8 local_984;
  int local_97c;
  undefined8 local_978;
  int local_970;
  undefined8 local_968;
  int local_960;
  undefined4 local_95c;
  undefined4 local_958;
  v3i To3;
  undefined8 local_910;
  uint local_904;
  int local_900;
  int local_8fc;
  undefined8 *local_8f8;
  v3i *local_8f0;
  undefined8 *local_8e8;
  undefined1 *local_8e0;
  undefined8 *local_8d8;
  u64 *local_8d0;
  undefined1 *local_8c8;
  v3i *local_8c0;
  extent *local_8b8;
  v3<int> *local_8b0;
  extent *local_8a8;
  v3<int> *local_8a0;
  extent *local_898;
  v3<int> *local_890;
  undefined8 *local_888;
  v3<int> *local_880;
  undefined8 *local_878;
  v3<int> *local_870;
  undefined8 *local_868;
  v3<int> *local_860;
  undefined8 *local_858;
  undefined1 *local_850;
  v2d *local_848;
  v2d *local_840;
  double *local_838;
  unsigned_long local_830;
  char local_821;
  long local_820;
  long local_818;
  undefined1 local_810 [8];
  timespec End_1;
  undefined1 local_7f8 [8];
  timespec End;
  undefined8 local_650;
  int local_648;
  undefined8 local_640;
  undefined4 local_638;
  undefined8 local_630;
  undefined4 local_628;
  undefined8 *local_620;
  undefined8 local_618;
  int local_610;
  undefined8 local_608;
  int local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  int local_5c0;
  undefined8 local_5b8;
  int local_5b0;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  int local_598;
  undefined8 local_590;
  int local_588;
  undefined8 local_580;
  int local_578;
  undefined8 local_570;
  int local_568;
  undefined8 local_560;
  int local_558;
  undefined8 local_550;
  undefined4 local_548;
  undefined8 local_540;
  undefined4 local_538;
  undefined8 *local_530;
  undefined8 local_528;
  int local_520;
  undefined8 local_518;
  int local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 local_4f8;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  int local_4d0;
  undefined8 local_4c8;
  int local_4c0;
  undefined8 *local_4b8;
  undefined8 local_4b0;
  int local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  undefined8 local_490;
  undefined4 local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined8 local_468;
  undefined4 local_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined8 *local_448;
  undefined8 local_440;
  undefined4 local_438;
  undefined8 local_430;
  undefined4 local_428;
  undefined8 local_420;
  undefined4 local_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined4 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  allocator **local_3c0;
  allocator **local_3b8;
  undefined1 local_3a9;
  ulong local_3a8;
  undefined1 local_399;
  ulong local_398;
  undefined1 local_389;
  ulong local_388;
  v3<int> *local_380;
  v3<int> *local_378;
  v3<int> *local_370;
  v3<int> *local_368;
  v3<int> *local_360;
  v3<int> *local_358;
  v3i *local_350;
  undefined8 *local_348;
  u64 *local_340;
  v3i *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined4 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined8 *local_288;
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined8 *local_250;
  undefined8 local_248;
  int local_240;
  long local_238;
  undefined8 local_230;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  undefined8 local_210;
  int local_208;
  long local_200;
  undefined8 local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  int local_1d0;
  u64 local_1c8;
  undefined8 local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  int local_198;
  u64 local_190;
  undefined8 local_188;
  int local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  undefined8 local_168;
  int local_160;
  undefined8 local_158;
  int local_150;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_148;
  undefined8 local_140;
  int local_138;
  undefined8 local_130;
  int local_128;
  long local_120;
  undefined8 local_118;
  int local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  undefined8 local_f8;
  int local_f0;
  undefined8 local_e8;
  int local_e0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_d8;
  undefined8 local_d0;
  int local_c8;
  undefined8 local_c0;
  int local_b8;
  long local_b0;
  undefined8 local_a8;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  undefined8 local_88;
  int local_80;
  undefined8 local_78;
  int local_70;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_68;
  undefined8 local_60;
  int local_58;
  undefined8 local_50;
  int local_48;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 local_40;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  undefined4 *local_18;
  undefined8 *local_10;
  
  iVar2 = (Idx2->BrickDimsExt3).field_0.field_0.X;
  iVar3 = (Idx2->BrickDimsExt3).field_0.field_0.Y;
  iVar4 = (Idx2->BrickDimsExt3).field_0.field_0.Z;
  paVar10 = &Mallocator()->super_allocator;
  this = &E.SortedSubChannels.Alloc;
  free_list_allocator::free_list_allocator
            ((free_list_allocator *)this,(long)(iVar2 * iVar3 * iVar4 * 8),paVar10);
  free_list_allocator::operator=((free_list_allocator *)BrickAlloc_,(free_list_allocator *)this);
  free_list_allocator::~free_list_allocator((free_list_allocator *)this);
  encode_data::encode_data((encode_data *)&__CleanUpFunc__394);
  __ScopeGuard__394._8_8_ = (encode_data *)&__CleanUpFunc__394;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp:394:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Encode_cpp:394:3)>
                 *)local_1070,(anon_class_8_1_54a397e5_for_Func *)&__ScopeGuard__394.Dismissed);
  Init((encode_data *)&__CleanUpFunc__394,(allocator *)0x0);
  local_3578 = (brick_traverse *)((long)&BrickDims3Ext.field_0.field_4.YZ.field_0 + 4);
  do {
    brick_traverse::brick_traverse(local_3578);
    local_3578 = local_3578 + 1;
  } while (local_3578 != (brick_traverse *)&Stack[0x7f].Address);
  BrickDims3Ext.field_0.field_0.Y = 0;
  if (0xf < (char)E.SubChannels.Alloc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  lVar11 = (long)(Idx2->NBricks3).Arr[(int)(char)E.SubChannels.Alloc].field_0.field_0.X;
  if (lVar11 == 0) {
    local_c28 = 1;
  }
  else {
    local_3a8 = lVar11 - 1;
    local_3a9 = 0xff;
    if (local_3a8 == 0) {
      local_3599 = -1;
    }
    else {
      lVar11 = 0x3f;
      if (local_3a8 != 0) {
        for (; local_3a8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      local_3599 = '?' - ((byte)lVar11 ^ 0x3f);
    }
    local_c28 = (undefined4)(1L << (local_3599 + 1U & 0x3f));
  }
  if (0xf < (char)E.SubChannels.Alloc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  lVar11 = (long)(Idx2->NBricks3).Arr[(int)(char)E.SubChannels.Alloc].field_0.field_0.Y;
  if (lVar11 == 0) {
    local_c38 = 1;
  }
  else {
    local_398 = lVar11 - 1;
    local_399 = 0xff;
    if (local_398 == 0) {
      local_35c1 = -1;
    }
    else {
      lVar11 = 0x3f;
      if (local_398 != 0) {
        for (; local_398 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      local_35c1 = '?' - ((byte)lVar11 ^ 0x3f);
    }
    local_c38 = (undefined4)(1L << (local_35c1 + 1U & 0x3f));
  }
  if (0xf < (char)E.SubChannels.Alloc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  lVar11 = (long)(Idx2->NBricks3).Arr[(int)(char)E.SubChannels.Alloc].field_0.field_0.Z;
  if (lVar11 == 0) {
    local_c48 = 1;
  }
  else {
    local_388 = lVar11 - 1;
    local_389 = 0xff;
    if (local_388 == 0) {
      local_35e9 = -1;
    }
    else {
      lVar11 = 0x3f;
      if (local_388 != 0) {
        for (; local_388 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      local_35e9 = '?' - ((byte)lVar11 ^ 0x3f);
    }
    local_c48 = (int)(1L << (local_35e9 + 1U & 0x3f));
  }
  local_3098 = local_c28;
  local_3094 = local_c38;
  BrickDims3Ext.field_0.field_0.X = local_c48;
  if (0xf < (char)E.SubChannels.Alloc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                 );
  }
  local_30d8 = (Idx2->BricksOrder).Arr[(int)(char)E.SubChannels.Alloc];
  if (0xf < (char)E.SubChannels.Alloc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                 );
  }
  local_30d0 = (Idx2->BricksOrder).Arr[(int)(char)E.SubChannels.Alloc];
  local_30c8 = 0;
  local_30c4 = 0;
  local_30c0 = 0;
  local_30e4 = 0;
  local_30e0 = 0;
  local_30dc = 0;
  local_ac4 = local_c28;
  local_ac8 = local_c38;
  local_30f0 = local_c48;
  local_ac0 = &local_ad8;
  local_ad8._0_4_ = local_c28;
  local_ad8._4_4_ = local_c38;
  Top = local_ad8;
  local_30bc = local_ad8;
  local_30b0 = 0;
  local_30a8 = 0;
  local_30a0 = 0;
  local_acc = local_30f0;
  local_30b4 = local_30f0;
  memcpy((void *)((long)&BrickDims3Ext.field_0 + 8),&local_30d8,0x40);
  eVar14.Dims = local_3398.Dims;
  eVar14.From = local_3398.From;
  while( true ) {
    while( true ) {
      while( true ) {
        local_3398 = eVar14;
        if (BrickDims3Ext.field_0.field_0.Y < 0) {
          local_9e8 = &Result.Code;
          clock_gettime(1,(timespec *)local_9e8);
          eVar15 = FlushChunks(Idx2,(encode_data *)&__CleanUpFunc__394);
          local_34e0 = eVar15.Msg._0_7_;
          uStack_34d9 = eVar15._7_4_;
          uStack_34d5 = eVar15._11_5_;
          auStack_34d0._0_7_ = local_34e0;
          unique0x1000254a = uStack_34d9;
          bVar13 = error::operator_cast_to_bool((error *)auStack_34d0);
          if (bVar13) {
            eVar15 = FlushChunkExponents(Idx2,(encode_data *)&__CleanUpFunc__394);
            local_3520 = eVar15.Msg._0_7_;
            uStack_3519 = eVar15._7_4_;
            uStack_3515 = eVar15._11_5_;
            auStack_3510._0_7_ = local_3520;
            unique0x10002546 = uStack_3519;
            bVar13 = error::operator_cast_to_bool((error *)auStack_3510);
            if (bVar13) {
              End_1.tv_nsec = (__syscall_slong_t)&Result.Code;
              clock_gettime(1,(timespec *)local_810);
              local_820 = (long)((double)((long)local_810 - *(long *)End_1.tv_nsec) * 1000000000.0 +
                                (double)(End_1.tv_sec - *(long *)(End_1.tv_nsec + 8)));
              TotalTime_ = TotalTime_ + (double)local_820 / 1000000000.0;
              pcVar1 = (char *)(*in_FS_OFFSET + -0xf80);
              snprintf(pcVar1,0x400,"%s/%s/%s.idx2",P->OutDir,&P->Meta,(P->Meta).Field);
              local_3540 = pcVar1;
              WriteMetaFile(Idx2,P,pcVar1);
              local_3c0 = &E.BrickPool.Alloc;
              printf("num channels            = %li\n",E.Channels.Stats);
              local_3b8 = &E.Channels.Alloc;
              printf("num sub channels        = %li\n",E.SubChannels.Stats);
              pcVar1 = (char *)(*in_FS_OFFSET + -0xf80);
              snprintf(pcVar1,0x400,"%s/%s/%s.idx2",P->OutDir,&P->Meta,(P->Meta).Field);
              local_3540 = pcVar1;
              PrintStats(pcVar1);
              printf("total time              = %f seconds\n",TotalTime_);
              eVar16 = Encode::anon_class_1_0_00000001::operator()(&local_3541);
              eVar15.Code = (undefined1)local_3530;
              eVar15.StackIdx = local_3530._1_1_;
              eVar15.StrGened = (bool)local_3530._2_1_;
              eVar15._11_5_ = local_3530._3_5_;
              eVar15.Msg = MetaFileName;
              Idx2_local = (idx2_file *)eVar16.Msg;
              local_3550 = eVar16._8_2_;
              local_c68 = local_3550;
              bStack_354e = eVar16.StrGened;
              uStack_c66 = bStack_354e;
            }
            else {
              local_3528.Result = (error<idx2::idx2_err_code> *)auStack_3510;
              eVar15 = Encode::anon_class_8_1_32d6a57b::operator()(&local_3528);
              Idx2_local = (idx2_file *)eVar15.Msg;
              local_3530._0_2_ = eVar15._8_2_;
              local_c68 = (undefined2)local_3530;
              local_3530._2_1_ = eVar15.StrGened;
              uStack_c66 = local_3530._2_1_;
            }
          }
          else {
            local_34e8.Result = (error<idx2::idx2_err_code> *)auStack_34d0;
            eVar16 = Encode::anon_class_8_1_32d6a57b::operator()(&local_34e8);
            eVar15.Code = (undefined1)local_3530;
            eVar15.StackIdx = local_3530._1_1_;
            eVar15.StrGened = (bool)local_3530._2_1_;
            eVar15._11_5_ = local_3530._3_5_;
            eVar15.Msg = MetaFileName;
            Idx2_local = (idx2_file *)eVar16.Msg;
            local_34f0 = eVar16._8_2_;
            local_c68 = local_34f0;
            bStack_34ee = eVar16.StrGened;
            uStack_c66 = bStack_34ee;
          }
          local_3530 = eVar15._8_8_;
          MetaFileName = eVar15.Msg;
          Result_1._12_4_ = 1;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp:394:3)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Encode_cpp:394:3)>
                          *)local_1070);
          eVar16.Code = (undefined1)local_c68;
          eVar16.StackIdx = local_c68._1_1_;
          eVar16.Msg = Idx2_local->Name;
          eVar16.StrGened = (bool)uStack_c66;
          eVar16._11_5_ = uStack_c65;
          return eVar16;
        }
        lVar11 = (long)BrickDims3Ext.field_0.field_0.Y;
        puStack_3100 = (ulong *)((long)&BrickDims3Ext + lVar11 * 0x40 + 8);
        local_3104 = (uint)*puStack_3100 & 3;
        *puStack_3100 = *puStack_3100 >> 2;
        if (local_3104 != 3) break;
        if (*puStack_3100 == 3) {
          *puStack_3100 = Stack[lVar11].BrickOrder;
        }
        else {
          Stack[lVar11].BrickOrder = *puStack_3100;
        }
      }
      BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + -1;
      local_a10 = &Stack[lVar11].BrickFrom3.field_0.field_0.Y;
      local_a18 = &Stack[lVar11].PrevOrder;
      local_9f4 = *local_a10 - (int)*local_a18;
      local_9f8 = Stack[lVar11].BrickFrom3.field_0.field_0.Z -
                  *(int *)((long)&Stack[lVar11].PrevOrder + 4);
      local_3108 = Stack[lVar11].BrickTo3.field_0.field_0.X -
                   Stack[lVar11].BrickFrom3.field_0.field_0.X;
      local_9f0 = &local_a08;
      local_a08._0_4_ = local_9f4;
      local_a08._4_4_ = local_9f8;
      local_a28 = local_a08;
      local_3110 = local_a08;
      uVar7 = local_3110;
      local_ab0 = &local_3110;
      local_ab4 = 1;
      local_3110._0_4_ = (int)local_a08;
      bVar13 = false;
      if ((int)local_3110 == 1) {
        local_3110._4_4_ = (int)((ulong)local_a08 >> 0x20);
        bVar13 = false;
        if (local_3110._4_4_ == 1) {
          bVar13 = local_3108 == 1;
        }
      }
      local_3110 = uVar7;
      local_a20 = local_3108;
      local_9fc = local_3108;
      if (!bVar13) break;
      local_9e0 = &BVol.NChildrenDecoded;
      clock_gettime(1,(timespec *)local_9e0);
      brick_volume::brick_volume((brick_volume *)((long)&Iter.N.field_0.field_3.XY.field_0 + 4));
      Resize((volume *)((long)&Iter.N.field_0.field_3.XY.field_0 + 4),&Idx2->BrickDimsExt3,float64,
             (allocator *)__CleanUpFunc__394.E);
      local_9b0 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)((long)&Iter.N.field_0 + 4);
      volume_iterator<double>::volume_iterator
                ((volume_iterator<double> *)((long)&Iter_1.N.field_0.field_3.XY.field_0 + 4));
      local_9a0 = &local_9bc;
      local_9a4 = 0;
      local_9bc._0_4_ = 0;
      local_9bc._4_4_ = 0;
      Iter.P.field_0.field_0.X = 0;
      Iter.Ptr = local_9bc;
      local_68 = local_9b0;
      local_40 = local_9b0[3].field_0;
      local_24 = (local_40.X << 0xb) >> 0xb;
      local_20 = &local_38;
      local_28 = (int)(((long)local_40 << 0x16) >> 0x2b);
      Iter.N.field_0.field_0.X = (int)((long)local_40 * 2 >> 0x2b);
      local_38._0_4_ = local_24;
      local_38._4_4_ = local_28;
      local_50 = local_38;
      local_78 = local_38;
      local_60 = local_38;
      local_88 = local_38;
      local_9d8 = local_38;
      local_9c8 = local_38;
      Iter.P.field_0.field_0.Y = (int)local_38;
      Iter.P.field_0.field_0.Z = (int)((ulong)local_38 >> 0x20);
      Iter_1.N.field_0.field_4.YZ.field_0 = (v2<int>)*local_9b0;
      To3.field_0.field_4.YZ.field_0 = (v2<int>)((long)&Iter.N.field_0 + 4);
      local_9d0 = Iter.N.field_0.field_0.X;
      local_9c0 = Iter.N.field_0.field_0.X;
      local_80 = Iter.N.field_0.field_0.X;
      local_70 = Iter.N.field_0.field_0.X;
      local_58 = Iter.N.field_0.field_0.X;
      local_48 = Iter.N.field_0.field_0.X;
      local_2c = Iter.N.field_0.field_0.X;
      volume_iterator<double>::volume_iterator((volume_iterator<double> *)auStack_31b0);
      local_d8 = (anon_union_8_4_6ba14846_for_v2<int>_1)To3.field_0.field_4.YZ.field_0;
      local_b0 = *(long *)((long)To3.field_0.field_4.YZ.field_0 + 0x18);
      local_94 = ((int)local_b0 << 0xb) >> 0xb;
      local_90 = &local_a8;
      local_98 = (int)((local_b0 << 0x16) >> 0x2b);
      local_970 = (int)(local_b0 * 2 >> 0x2b);
      local_a8._0_4_ = local_94;
      local_a8._4_4_ = local_98;
      local_c0 = local_a8;
      local_e8 = local_a8;
      local_d0 = local_a8;
      local_f8 = local_a8;
      local_978 = local_a8;
      local_968 = local_a8;
      local_95c = 0;
      local_958 = 0;
      local_148 = (anon_union_8_4_6ba14846_for_v2<int>_1)To3.field_0.field_4.YZ.field_0;
      local_120 = *(long *)((long)To3.field_0.field_4.YZ.field_0 + 0x18);
      local_104 = ((int)local_120 << 0xb) >> 0xb;
      local_100 = &local_118;
      local_108 = (int)((local_120 << 0x16) >> 0x2b);
      local_990 = (int)(local_120 * 2 >> 0x2b);
      local_118._0_4_ = local_104;
      local_118._4_4_ = local_108;
      local_130 = local_118;
      local_158 = local_118;
      local_140 = local_118;
      local_168 = local_118;
      local_998 = local_118;
      local_984 = local_118;
      uVar7 = local_984;
      local_10 = &local_984;
      local_18 = &local_95c;
      local_984._0_4_ = (int)local_118;
      local_984._4_4_ = (int)((ulong)local_118 >> 0x20);
      auStack_31b0 = (undefined1  [8])
                     (*(long *)To3.field_0.field_4.YZ.field_0 +
                     (long)local_970 * (long)(int)local_984 * (long)local_984._4_4_ * 8);
      BrickExtent.Dims = 0;
      Beg.N.field_0.field_0.X = Iter.P.field_0.field_0.Y;
      Beg.P.field_0.field_0.Z = Iter.P.field_0.field_0.X;
      Beg.N.field_0.field_0.Z = Iter.N.field_0.field_0.X;
      Beg.N.field_0.field_0.Y = Iter.P.field_0.field_0.Z;
      Beg.P.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)Iter.Ptr;
      Beg.Ptr = (double *)Iter_1.N.field_0.field_4.YZ.field_0;
      End_00.P.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)Iter_1.Ptr;
      End_00.Ptr = (double *)auStack_31b0;
      End_00._16_8_ = Iter_1.P.field_0.field_3.XY.field_0;
      End_00.N.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)Iter_1._16_8_;
      local_984 = uVar7;
      local_97c = local_990;
      local_960 = local_970;
      local_160 = local_990;
      local_150 = local_990;
      local_138 = local_990;
      local_128 = local_990;
      local_10c = local_990;
      local_f0 = local_970;
      local_e0 = local_970;
      local_c8 = local_970;
      local_b8 = local_970;
      local_9c = local_970;
      To3.field_0.field_0.X = local_970;
      Fill<idx2::volume_iterator<double>,double>(Beg,End_00,(double *)&BrickExtent.Dims);
      uVar5 = (Idx2->BrickDims3).field_0.field_0.X;
      Val = (brick_volume *)(ulong)uVar5;
      local_8fc = (int)puStack_3100[2] * uVar5;
      local_900 = *(int *)((long)puStack_3100 + 0x14) * (Idx2->BrickDims3).field_0.field_0.Y;
      local_31cc = (int)puStack_3100[3] * (Idx2->BrickDims3).field_0.field_0.Z;
      local_8f8 = &local_910;
      local_910._0_4_ = local_8fc;
      local_910._4_4_ = local_900;
      BrickExtentCrop.Dims = local_910;
      local_31d4 = local_910;
      uVar12 = local_31d4;
      local_8f0 = &Idx2->BrickDims3;
      local_8e0 = local_31c8;
      local_8e8 = &local_31d4;
      local_31d4._0_4_ = (uint)local_910;
      local_31d4._4_4_ = (uint)(local_910 >> 0x20);
      local_31c8 = (undefined1  [8])
                   ((long)(int)((uint)local_31d4 & 0x1fffff) +
                    (long)(int)(local_31d4._4_4_ & 0x1fffff) * 0x200000 +
                   ((long)(int)(local_31cc & 0x1fffff) << 0x2a));
      BrickExtent.From =
           (long)(int)((local_8f0->field_0).field_0.X & 0x1fffff) +
           (long)(int)((Idx2->BrickDims3).field_0.field_0.Y & 0x1fffff) * 0x200000 +
           ((long)(int)((Idx2->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a);
      local_8c0 = &Idx2->Dims3;
      local_8b8 = &local_3208;
      local_3208.From = 0;
      local_3208.Dims =
           (long)(int)((local_8c0->field_0).field_0.X & 0x1fffff) +
           (long)(int)((Idx2->Dims3).field_0.field_0.Y & 0x1fffff) * 0x200000 +
           ((long)(int)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a);
      local_31d4 = uVar12;
      local_904 = local_31cc;
      local_350 = local_8c0;
      local_338 = local_8f0;
      local_330 = local_8e8;
      eVar14 = Crop<idx2::extent,idx2::extent>((extent *)local_31c8,&local_3208);
      BrickExtentCrop.From = eVar14.Dims;
      local_31f8 = (undefined1  [8])eVar14.From;
      eVar14 = Relative<idx2::extent,idx2::extent>((extent *)local_31f8,(extent *)local_31c8);
      BVol.ExtentLocal.From = eVar14.Dims;
      paVar10 = (allocator *)eVar14.From;
      MinMax.field_0.field_0.Y = (double)paVar10;
      BVol.Vol._32_8_ = paVar10;
      (**Copier->_vptr_brick_copier)
                (Copier,local_31f8,&BVol.Vol.Type,(undefined1 *)((long)&Iter.N.field_0 + 4));
      local_848 = &Idx2->ValueRange;
      local_850 = (undefined1 *)&stack0xffffffffffffcdd8;
      local_36d0 = paVar10;
      if ((local_848->field_0).field_0.X <= (double)paVar10) {
        local_36d0 = (allocator *)(local_848->field_0).field_0.X;
      }
      (Idx2->ValueRange).field_0.field_0.X = (double)local_36d0;
      local_838 = &(Idx2->ValueRange).field_0.field_0.Y;
      local_840 = &MinMax;
      local_36e0 = in_XMM1_Qa;
      if (in_XMM1_Qa <= *local_838) {
        local_36e0 = *local_838;
      }
      (Idx2->ValueRange).field_0.field_0.Y = local_36e0;
      E.SubChannels.Alloc._0_1_ = '\0';
      BrickKey = puStack_3100[2];
      local_3240 = (uint)puStack_3100[3];
      Brick3.field_0.field_0.Y = 0;
      Brick3.field_0.field_0.X = local_3240;
      Brick3.field_0._8_4_ = SUB84(Val,0);
      local_3238 = BrickKey;
      local_3230 = local_3240;
      local_3228 = paVar10;
      MinMax.field_0.field_0.X = in_XMM1_Qa;
      E.Brick._128_8_ = BrickKey;
      E.Bricks3.Arr[0].field_0.field_0.X = local_3240;
      uVar12 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)0x0,(int)BrickKey,Brick3);
      if (0xf < (char)E.SubChannels.Alloc) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                     );
      }
      E.Brick.Arr[(long)(int)(char)E.SubChannels.Alloc + -1] = uVar12;
      if (0xf < (char)E.SubChannels.Alloc) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                     );
      }
      local_830 = E.Brick.Arr[(long)(int)(char)E.SubChannels.Alloc + -1];
      local_821 = (char)E.SubChannels.Alloc;
      local_3250 = (unsigned_long *)(local_830 * 0x10 + (long)(char)E.SubChannels.Alloc);
      Insert<unsigned_long,idx2::brick_volume>
                ((iterator *)&First.Address,(idx2 *)&E,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&stack0xffffffffffffcdb0,
                 (unsigned_long *)&Iter.N.field_0.field_0.Y,Val);
      EncodeBrick(Idx2,P,(encode_data *)&__CleanUpFunc__394,false);
      End.tv_nsec = (__syscall_slong_t)&BVol.NChildrenDecoded;
      clock_gettime(1,(timespec *)local_7f8);
      local_818 = (long)((double)((long)local_7f8 - *(long *)End.tv_nsec) * 1000000000.0 +
                        (double)(End.tv_sec - *(long *)(End.tv_nsec + 8)));
      in_XMM1_Qa = 1000000000.0;
      TotalTime_ = (double)local_818 / 1000000000.0 + TotalTime_;
      eVar14 = local_3398;
    }
    memcpy(&Second.Address,puStack_3100,0x40);
    memcpy(&Skip.Dims,puStack_3100,0x40);
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)((long)&First.BrickFrom3.field_0 + (long)(int)local_3104 * 4 + 4) =
         *(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x10) +
         (*(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x1c) -
         *(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x10)) / 2;
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    if (2 < (int)local_3104) break;
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    if (2 < (int)local_3104) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)((long)&Second.PrevOrder + (long)(int)local_3104 * 4) =
         *(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x10) +
         (*(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x1c) -
         *(int *)((long)puStack_3100 + (long)(int)local_3104 * 4 + 0x10)) / 2;
    uVar8 = First.BrickTo3.field_0.field_4.YZ.field_0;
    local_a58 = &First.PrevOrder;
    local_a50 = (undefined1 *)((long)&First.BrickFrom3.field_0 + 4);
    local_a34 = First.BrickFrom3.field_0.field_0.Y - (uint)First.PrevOrder;
    local_a38 = First.BrickFrom3.field_0.field_0.Z - First.PrevOrder._4_4_;
    local_3318 = First.BrickTo3.field_0.field_0.X - First.BrickFrom3.field_0._0_4_;
    local_a30 = &local_a48;
    local_a48._0_4_ = local_a34;
    local_a48._4_4_ = local_a38;
    local_a68 = local_a48;
    local_3320 = local_a48;
    local_330c = local_a48;
    uVar7 = local_330c;
    local_8c8 = local_3300;
    local_8d8 = &local_330c;
    local_3300 = (undefined1  [8])
                 ((long)(int)((uint)First.PrevOrder & 0x1fffff) +
                  (long)(int)(First.PrevOrder._4_4_ & 0x1fffff) * 0x200000 +
                 ((long)(int)(First.BrickFrom3.field_0.field_0.X & 0x1fffff) << 0x2a));
    local_330c._0_4_ = (uint)local_a48;
    local_330c._4_4_ = (uint)((ulong)local_a48 >> 0x20);
    Skip.From = (long)(int)((uint)local_330c & 0x1fffff) +
                (long)(int)(local_330c._4_4_ & 0x1fffff) * 0x200000 +
                ((long)(int)(local_3304 & 0x1fffff) << 0x2a);
    local_330c = uVar7;
    local_3304 = local_3318;
    local_a60 = local_3318;
    local_a3c = local_3318;
    local_8d0 = local_a58;
    local_348 = local_8d8;
    local_340 = local_a58;
    if (0xf < (char)E.SubChannels.Alloc) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_8b0 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
    local_8a8 = &local_3368;
    local_3368.From = 0;
    local_3368.Dims =
         (long)(int)((local_8b0->field_0).field_0.X & 0x1fffff) +
         (long)(int)((local_8b0->field_0).field_0.Y & 0x1fffff) * 0x200000 +
         ((long)(int)((local_8b0->field_0).field_0.Z & 0x1fffff) << 0x2a);
    local_358 = local_8b0;
    eVar14 = Crop<idx2::extent,idx2::extent>((extent *)local_3300,&local_3368);
    iVar2 = (int)First.NBricksBefore;
    local_1c8 = eVar14.Dims;
    local_1ac = ((int)eVar14.Dims << 0xb) >> 0xb;
    local_1a8 = &local_1c0;
    local_1b0 = (int)((long)(local_1c8 << 0x16) >> 0x2b);
    local_3370 = (int)((long)(local_1c8 * 2) >> 0x2b);
    local_1c0._0_4_ = local_1ac;
    local_1c0._4_4_ = local_1b0;
    local_1d8 = local_1c0;
    local_3378 = local_1c0;
    local_3344 = local_1c0;
    uVar7 = local_3344;
    local_3344._0_4_ = (int)local_1c0;
    local_3338 = (long)(int)local_3344;
    local_3344._4_4_ = (int)((ulong)local_1c0 >> 0x20);
    local_3330 = (long)local_3344._4_4_;
    local_3328 = (long)local_3370;
    Second.BrickTo3.field_0.field_4.YZ.field_0 =
         (v2<int>)(uVar8 + local_3338 * local_3330 * local_3328);
    local_3344 = uVar7;
    local_333c = local_3370;
    local_1d0 = local_3370;
    local_1b4 = local_3370;
    local_3358 = eVar14;
    if (0xf < (char)E.SubChannels.Alloc) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_8a0 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
    local_898 = &local_33a8;
    local_33a8.From = 0;
    local_33a8.Dims =
         (long)(int)((local_8a0->field_0).field_0.X & 0x1fffff) +
         (long)(int)((local_8a0->field_0).field_0.Y & 0x1fffff) * 0x200000 +
         ((long)(int)((local_8a0->field_0).field_0.Z & 0x1fffff) << 0x2a);
    local_360 = local_8a0;
    eVar14 = Crop<idx2::extent,idx2::extent>((extent *)local_3300,&local_33a8);
    local_190 = eVar14.Dims;
    local_174 = ((int)eVar14.Dims << 0xb) >> 0xb;
    local_170 = &local_188;
    local_178 = (int)((long)(local_190 << 0x16) >> 0x2b);
    local_33b0 = (int)((long)(local_190 * 2) >> 0x2b);
    local_188._0_4_ = local_174;
    local_188._4_4_ = local_178;
    local_1a0 = local_188;
    local_33b8 = local_188;
    local_3384 = local_188;
    uVar8 = local_3384;
    local_3384._0_4_ = (int)local_188;
    local_3384._4_4_ = (int)((ulong)local_188 >> 0x20);
    Second.NBricksBefore._0_4_ = iVar2 + (int)local_3384 * local_3384._4_4_ * local_33b0;
    First._48_8_ = puStack_3100[7];
    local_a90 = (undefined1 *)((long)&First.BrickFrom3.field_0 + 4);
    local_a98 = &First.PrevOrder;
    local_a74 = First.BrickFrom3.field_0.field_0.Y - (uint)First.PrevOrder;
    local_a78 = First.BrickFrom3.field_0.field_0.Z - First.PrevOrder._4_4_;
    local_33e8 = First.BrickTo3.field_0.field_0.X - First.BrickFrom3.field_0._0_4_;
    local_a70 = &local_a88;
    local_a88._0_4_ = local_a74;
    local_a88._4_4_ = local_a78;
    local_aa8 = local_a88;
    local_33f0 = local_a88;
    local_33dc = local_a88;
    uVar7 = local_33dc;
    local_33dc._0_4_ = (int)local_a88;
    local_33d0 = (long)(int)local_33dc;
    local_33dc._4_4_ = (int)((ulong)local_a88 >> 0x20);
    local_33c8 = (long)local_33dc._4_4_;
    local_33c0 = (long)local_33e8;
    Second._48_8_ = puStack_3100[7] + local_33d0 * local_33c8 * local_33c0;
    local_33dc = uVar7;
    local_33d4 = local_33e8;
    local_3384 = uVar8;
    local_337c = local_33b0;
    local_aa0 = local_33e8;
    local_a7c = local_33e8;
    local_198 = local_33b0;
    local_17c = local_33b0;
    local_3398 = eVar14;
    if (0xf < (char)E.SubChannels.Alloc) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_890 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
    local_888 = &local_3410;
    local_3410 = 0;
    lVar11 = (long)(int)((local_890->field_0).field_0.X & 0x1fffff) +
             (long)(int)((local_890->field_0).field_0.Y & 0x1fffff) * 0x200000 +
             ((long)(int)((local_890->field_0).field_0.Z & 0x1fffff) << 0x2a);
    local_530 = &local_3410;
    local_270 = 0;
    local_254 = 0;
    local_250 = &local_268;
    local_258 = 0;
    local_548 = 0;
    local_268._0_4_ = 0;
    local_268._4_4_ = 0;
    local_280 = local_268;
    local_490 = local_268;
    local_478 = local_268;
    local_4a0 = local_268;
    local_550 = local_268;
    local_540 = local_268;
    uVar9 = local_540;
    local_238 = local_3408;
    local_21c = ((int)local_3408 << 0xb) >> 0xb;
    local_218 = &local_230;
    local_220 = (int)((local_3408 << 0x16) >> 0x2b);
    local_3418 = (int)(local_3408 * 2 >> 0x2b);
    local_230._0_4_ = local_21c;
    local_230._4_4_ = local_220;
    local_248 = local_230;
    local_4c8 = local_230;
    local_4b0 = local_230;
    local_4d8 = local_230;
    local_570 = local_230;
    local_560 = local_230;
    uVar8 = local_560;
    local_500 = &local_540;
    local_508 = &local_560;
    local_540._0_4_ = (int)local_268;
    local_540._4_4_ = (int)((ulong)local_268 >> 0x20);
    local_560._0_4_ = (int)local_230;
    local_560._4_4_ = (int)((ulong)local_230 >> 0x20);
    local_4e4 = (int)local_540 + (int)local_560;
    local_4e8 = local_540._4_4_ + local_560._4_4_;
    local_4e0 = &local_4f8;
    local_4f8._0_4_ = local_4e4;
    local_4f8._4_4_ = local_4e8;
    local_518 = local_4f8;
    local_580 = local_4f8;
    local_528 = local_4f8;
    local_590 = local_4f8;
    local_3420 = local_4f8;
    local_33fc = local_4f8;
    uVar7 = local_33fc;
    local_33fc._0_4_ = (int)local_4f8;
    bVar13 = false;
    if ((int)Second.PrevOrder < (int)local_33fc) {
      local_33fc._4_4_ = (int)((ulong)local_4f8 >> 0x20);
      bVar13 = false;
      if (Second.PrevOrder._4_4_ < local_33fc._4_4_) {
        bVar13 = Second.BrickFrom3.field_0.field_0.X < local_3418;
      }
    }
    bVar6 = false;
    local_33fc = uVar7;
    local_33f4 = local_3418;
    local_588 = local_3418;
    local_578 = local_3418;
    local_568 = local_3418;
    local_560 = uVar8;
    local_558 = local_3418;
    local_540 = uVar9;
    local_538 = local_548;
    local_520 = local_3418;
    local_510 = local_3418;
    local_4ec = local_3418;
    local_4d0 = local_3418;
    local_4c0 = local_3418;
    local_4b8 = local_530;
    local_4a8 = local_3418;
    local_498 = local_548;
    local_488 = local_548;
    local_480 = local_530;
    local_470 = local_548;
    local_368 = local_890;
    local_278 = local_548;
    local_25c = local_548;
    local_240 = local_3418;
    local_224 = local_3418;
    local_3408 = lVar11;
    if (bVar13) {
      if (0xf < (char)E.SubChannels.Alloc) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      local_880 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
      local_878 = &local_3440;
      local_3440 = 0;
      local_3438 = (long)(int)((local_880->field_0).field_0.X & 0x1fffff) +
                   (long)(int)((local_880->field_0).field_0.Y & 0x1fffff) * 0x200000 +
                   ((long)(int)((local_880->field_0).field_0.Z & 0x1fffff) << 0x2a);
      local_3d8 = &local_3440;
      local_318 = 0;
      local_2fc = 0;
      local_2f8 = &local_310;
      local_300 = 0;
      local_3448 = 0;
      local_310._0_4_ = 0;
      local_310._4_4_ = 0;
      local_328 = local_310;
      local_3e8 = local_310;
      local_3d0 = local_310;
      local_3f8 = local_310;
      local_3450 = local_310;
      local_342c = local_310;
      uVar7 = local_342c;
      local_342c._0_4_ = (int)local_310;
      bVar6 = false;
      bVar13 = (int)local_342c < Second.BrickFrom3.field_0.field_0.Y;
      local_342c = uVar7;
      local_3424 = local_3448;
      local_3f0 = local_3448;
      local_3e0 = local_3448;
      local_3c8 = local_3448;
      local_370 = local_880;
      local_320 = local_3448;
      local_304 = local_3448;
      if (bVar13) {
        local_342c._4_4_ = (int)((ulong)local_310 >> 0x20);
        bVar6 = false;
        bVar13 = local_342c._4_4_ < Second.BrickFrom3.field_0.field_0.Z;
        if (bVar13) {
          bVar6 = 0 < Second.BrickTo3.field_0.field_0.X;
        }
      }
    }
    if (bVar6) {
      BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + 1;
      memcpy((void *)((long)&BrickDims3Ext + (long)BrickDims3Ext.field_0.field_0.Y * 0x40 + 8),
             &Skip.Dims,0x40);
      eVar14 = local_3398;
    }
    local_3398 = eVar14;
    if (0xf < (char)E.SubChannels.Alloc) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_870 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
    local_868 = &local_3470;
    local_3470 = 0;
    lVar11 = (long)(int)((local_870->field_0).field_0.X & 0x1fffff) +
             (long)(int)((local_870->field_0).field_0.Y & 0x1fffff) * 0x200000 +
             ((long)(int)((local_870->field_0).field_0.Z & 0x1fffff) << 0x2a);
    local_620 = &local_3470;
    local_2a8 = 0;
    local_28c = 0;
    local_288 = &local_2a0;
    local_290 = 0;
    local_638 = 0;
    local_2a0._0_4_ = 0;
    local_2a0._4_4_ = 0;
    local_2b8 = local_2a0;
    local_458 = local_2a0;
    local_440 = local_2a0;
    local_468 = local_2a0;
    local_640 = local_2a0;
    local_630 = local_2a0;
    uVar9 = local_630;
    local_200 = local_3468;
    local_1e4 = ((int)local_3468 << 0xb) >> 0xb;
    local_1e0 = &local_1f8;
    local_1e8 = (int)((local_3468 << 0x16) >> 0x2b);
    local_3478 = (int)(local_3468 * 2 >> 0x2b);
    local_1f8._0_4_ = local_1e4;
    local_1f8._4_4_ = local_1e8;
    local_210 = local_1f8;
    local_5b8 = local_1f8;
    local_5a0 = local_1f8;
    local_5c8 = local_1f8;
    local_650 = local_1f8;
    uVar8 = local_650;
    local_5f0 = &local_630;
    local_5f8 = &local_650;
    local_630._0_4_ = (int)local_2a0;
    local_630._4_4_ = (int)((ulong)local_2a0 >> 0x20);
    local_650._0_4_ = (int)local_1f8;
    local_650._4_4_ = (int)((ulong)local_1f8 >> 0x20);
    local_5d4 = (int)local_630 + (int)local_650;
    local_5d8 = local_630._4_4_ + local_650._4_4_;
    local_5d0 = &local_5e8;
    local_5e8._0_4_ = local_5d4;
    local_5e8._4_4_ = local_5d8;
    local_608 = local_5e8;
    local_618 = local_5e8;
    local_3480 = local_5e8;
    local_345c = local_5e8;
    uVar7 = local_345c;
    local_345c._0_4_ = (int)local_5e8;
    bVar13 = false;
    if ((int)(uint)First.PrevOrder < (int)local_345c) {
      local_345c._4_4_ = (int)((ulong)local_5e8 >> 0x20);
      bVar13 = false;
      if ((int)First.PrevOrder._4_4_ < local_345c._4_4_) {
        bVar13 = First.BrickFrom3.field_0.field_0.X < local_3478;
      }
    }
    bVar6 = false;
    local_345c = uVar7;
    local_3454 = local_3478;
    local_650 = uVar8;
    local_648 = local_3478;
    local_630 = uVar9;
    local_628 = local_638;
    local_610 = local_3478;
    local_600 = local_3478;
    local_5dc = local_3478;
    local_5c0 = local_3478;
    local_5b0 = local_3478;
    local_5a8 = local_620;
    local_598 = local_3478;
    local_460 = local_638;
    local_450 = local_638;
    local_448 = local_620;
    local_438 = local_638;
    local_378 = local_870;
    local_2b0 = local_638;
    local_294 = local_638;
    local_208 = local_3478;
    local_1ec = local_3478;
    local_3468 = lVar11;
    if (bVar13) {
      if (0xf < (char)E.SubChannels.Alloc) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      local_860 = (Idx2->NBricks3).Arr + (int)(char)E.SubChannels.Alloc;
      local_858 = &local_34a0;
      local_34a0 = 0;
      local_3498 = (long)(int)((local_860->field_0).field_0.X & 0x1fffff) +
                   (long)(int)((local_860->field_0).field_0.Y & 0x1fffff) * 0x200000 +
                   ((long)(int)((local_860->field_0).field_0.Z & 0x1fffff) << 0x2a);
      local_410 = &local_34a0;
      local_2e0 = 0;
      local_2c4 = 0;
      local_2c0 = &local_2d8;
      local_2c8 = 0;
      local_3484 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2f0 = local_2d8;
      local_420 = local_2d8;
      local_408 = local_2d8;
      local_430 = local_2d8;
      local_348c = local_2d8;
      uVar7 = local_348c;
      local_348c._0_4_ = (int)local_2d8;
      bVar6 = false;
      bVar13 = (int)local_348c < First.BrickFrom3.field_0.field_0.Y;
      local_348c = uVar7;
      local_428 = local_3484;
      local_418 = local_3484;
      local_400 = local_3484;
      local_380 = local_860;
      local_2e8 = local_3484;
      local_2cc = local_3484;
      if (bVar13) {
        local_348c._4_4_ = (int)((ulong)local_2d8 >> 0x20);
        bVar6 = false;
        bVar13 = local_348c._4_4_ < First.BrickFrom3.field_0.field_0.Z;
        if (bVar13) {
          bVar6 = 0 < First.BrickTo3.field_0.field_0.X;
        }
      }
    }
    if (bVar6) {
      BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + 1;
      memcpy((void *)((long)&BrickDims3Ext + (long)BrickDims3Ext.field_0.field_0.Y * 0x40 + 8),
             &Second.Address,0x40);
      eVar14 = local_3398;
    }
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

error<idx2_err_code>
Encode(idx2_file* Idx2, const params& P, brick_copier& Copier)
{
  const int BrickBytes = Prod(Idx2->BrickDimsExt3) * sizeof(f64);
  BrickAlloc_ = free_list_allocator(BrickBytes);
  idx2_RAII(encode_data, E, Init(&E));
  idx2_BrickTraverse(
    timer Timer; StartTimer(&Timer);
    //    idx2_Assert(GetLinearBrick(*Idx2, 0, Top.BrickFrom3) == Top.Address);
    //    idx2_Assert(GetSpatialBrick(*Idx2, 0, Top.Address) == Top.BrickFrom3);
    // BVol = local brick storage (we will copy brick data from the input to this)
    brick_volume BVol;
    Resize(&BVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E.Alloc);
    Fill(idx2_Range(f64, BVol.Vol), 0.0);
    extent BrickExtent(Top.BrickFrom3 * Idx2->BrickDims3, Idx2->BrickDims3);
    // BrickExtentCrop = the true extent of the brick (boundary bricks are cropped)
    extent BrickExtentCrop = Crop(BrickExtent, extent(Idx2->Dims3));
    BVol.ExtentLocal = Relative(BrickExtentCrop, BrickExtent);
    v2d MinMax = Copier.Copy(BrickExtentCrop, BVol.ExtentLocal, &BVol);
    Idx2->ValueRange.Min = Min(Idx2->ValueRange.Min, MinMax.Min);
    Idx2->ValueRange.Max = Max(Idx2->ValueRange.Max, MinMax.Max);
    //    Copy(BrickExtentCrop, Vol, BVol.ExtentLocal, &BVol.Vol);
    E.Level = 0;
    E.Bricks3[E.Level] = Top.BrickFrom3;
    E.Brick[E.Level] = GetLinearBrick(*Idx2, E.Level, E.Bricks3[E.Level]);
    idx2_Assert(E.Brick[E.Level] == Top.Address);
    u64 BrickKey = GetBrickKey(E.Level, E.Brick[E.Level]);
    Insert(&E.BrickPool, BrickKey, BVol);
    EncodeBrick(Idx2, P, &E);
    TotalTime_ += Seconds(ElapsedTime(&Timer));
    ,
    128,
    Idx2->BricksOrder[E.Level],
    v3i(0),
    Idx2->NBricks3[E.Level],
    extent(Idx2->NBricks3[E.Level]),
    extent(Idx2->NBricks3[E.Level])
  );

  /* dump the bit streams to files */
  timer Timer;
  StartTimer(&Timer);
  idx2_PropagateIfError(FlushChunks(*Idx2, &E));
  idx2_PropagateIfError(FlushChunkExponents(*Idx2, &E));
  TotalTime_ += Seconds(ElapsedTime(&Timer));

  cstr MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  WriteMetaFile(*Idx2, P, MetaFileName);
  printf("num channels            = %" PRIi64 "\n", Size(E.Channels));
  printf("num sub channels        = %" PRIi64 "\n", Size(E.SubChannels));
  MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  PrintStats(MetaFileName);
  printf("total time              = %f seconds\n", TotalTime_);
  //  _ASSERTE( _CrtCheckMemory( ) );
  return idx2_Error(idx2_err_code::NoError);
}